

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_21e63::TestFixturesWithThrowingDtorsAreFailures::
~TestFixturesWithThrowingDtorsAreFailures(TestFixturesWithThrowingDtorsAreFailures *this)

{
  TestFixturesWithThrowingDtorsAreFailures *this_local;
  
  ~TestFixturesWithThrowingDtorsAreFailures(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(FixturesWithThrowingDtorsAreFailures)
{
	CHECK(throwingFixtureTestList2.GetHead() != NULL);

	RecordingReporter reporter;
	TestResults result(&reporter);
	{
		ScopedCurrentTest scopedResult(result);
		throwingFixtureTestList2.GetHead()->Run();
	}

	int const failureCount = result.GetFailedTestCount();
	CHECK_EQUAL(1, failureCount);
	CHECK(strstr(reporter.lastFailedMessage, "while destroying fixture"));
}